

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::base::TypedConfigurations::unsafeValidateFileRolling
          (TypedConfigurations *this,Level level,PreRollOutCallback *preRollOutCallback)

{
  fstream_t *fs;
  pointer pcVar1;
  bool bVar2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar3;
  unsigned_long uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 uVar6;
  string fname;
  long *local_60 [2];
  long local_50 [2];
  size_t local_40;
  long *local_38;
  
  psVar3 = unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                     (this,level,&this->m_fileStreamMap,"fileStream");
  fs = (psVar3->
       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  bVar2 = true;
  if (fs != (fstream_t *)0x0) {
    uVar4 = unsafeGetConfigByVal<unsigned_long>
                      (this,level,&this->m_maxLogFileSizeMap,"maxLogFileSize");
    local_40 = utils::File::getSizeOfFile(fs);
    if (uVar4 - 1 < local_40) {
      pbVar5 = unsafeGetConfigByRef<std::__cxx11::string>
                         (this,level,&this->m_filenameMap,"filename");
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar1,pcVar1 + pbVar5->_M_string_length);
      std::fstream::close();
      local_38 = local_60[0];
      if ((preRollOutCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar6 = std::__throw_bad_function_call();
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
      (*preRollOutCallback->_M_invoker)
                ((_Any_data *)preRollOutCallback,(char **)&local_38,&local_40);
      std::fstream::open((string *)fs,(_Ios_Openmode)local_60);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool TypedConfigurations::unsafeValidateFileRolling(Level level, const PreRollOutCallback& preRollOutCallback) {
  base::type::fstream_t* fs = unsafeGetConfigByRef(level, &m_fileStreamMap, "fileStream").get();
  if (fs == nullptr) {
    return true;
  }
  std::size_t maxLogFileSize = unsafeGetConfigByVal(level, &m_maxLogFileSizeMap, "maxLogFileSize");
  std::size_t currFileSize = base::utils::File::getSizeOfFile(fs);
  if (maxLogFileSize != 0 && currFileSize >= maxLogFileSize) {
    std::string fname = unsafeGetConfigByRef(level, &m_filenameMap, "filename");
    ELPP_INTERNAL_INFO(1, "Truncating log file [" << fname << "] as a result of configurations for level ["
                       << LevelHelper::convertToString(level) << "]");
    fs->close();
    preRollOutCallback(fname.c_str(), currFileSize);
    fs->open(fname, std::fstream::out | std::fstream::trunc);
    return true;
  }
  return false;
}